

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

void duckdb::BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t>::
     BitpackingWriter::WriteDeltaFor
               (uhugeint_t *values,bool *validity,bitpacking_width_t width,
               uhugeint_t frame_of_reference,hugeint_t delta_offset,uhugeint_t *original_values,
               idx_t count,void *data_ptr)

{
  uint64_t *puVar1;
  idx_t iVar2;
  undefined7 in_register_00000011;
  uhugeint_t local_48;
  
  iVar2 = BitpackingPrimitives::GetRequiredSize(count,width);
  ReserveSpace((BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t> *)data_ptr,
               iVar2 + 0x30);
  WriteMetaData((BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t> *)data_ptr,
                DELTA_FOR);
  puVar1 = *(uint64_t **)((long)data_ptr + 0x40);
  *puVar1 = frame_of_reference.lower;
  puVar1[1] = frame_of_reference.upper;
  *(uint64_t **)((long)data_ptr + 0x40) = puVar1 + 2;
  uhugeint_t::uhugeint_t(&local_48,CONCAT71(in_register_00000011,width) & 0xffffffff);
  puVar1 = *(uint64_t **)((long)data_ptr + 0x40);
  *puVar1 = local_48.lower;
  puVar1[1] = local_48.upper;
  puVar1[2] = delta_offset.lower;
  puVar1[3] = delta_offset.upper;
  *(uint64_t **)((long)data_ptr + 0x40) = puVar1 + 4;
  BitpackingPrimitives::PackBuffer<duckdb::uhugeint_t,false>
            ((data_ptr_t)(puVar1 + 4),values,count,width);
  *(long *)((long)data_ptr + 0x40) = *(long *)((long)data_ptr + 0x40) + iVar2;
  UpdateStats((BitpackingCompressionState<duckdb::uhugeint_t,_true,_duckdb::hugeint_t> *)data_ptr,
              count);
  return;
}

Assistant:

static void WriteDeltaFor(T *values, bool *validity, bitpacking_width_t width, T frame_of_reference,
		                          T_S delta_offset, T *original_values, idx_t count, void *data_ptr) {
			auto state = reinterpret_cast<BitpackingCompressionState<T, WRITE_STATISTICS> *>(data_ptr);

			auto bp_size = BitpackingPrimitives::GetRequiredSize(count, width);
			ReserveSpace(state, bp_size + 3 * sizeof(T));

			WriteMetaData(state, BitpackingMode::DELTA_FOR);
			WriteData(state->data_ptr, frame_of_reference);
			WriteData(state->data_ptr, static_cast<T>(width));
			WriteData(state->data_ptr, delta_offset);

			BitpackingPrimitives::PackBuffer<T, false>(state->data_ptr, values, count, width);
			state->data_ptr += bp_size;

			UpdateStats(state, count);
		}